

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O2

utf8char_t * VTuneChakraProfile::GetUrl(FunctionBody *body,size_t *urlBufferLength)

{
  char16_t *string;
  uint32 uVar1;
  SourceContextInfo *pSVar2;
  size_t sVar3;
  HeapAllocator *this;
  utf8char_t *puVar4;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pSVar2 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)body);
  puVar4 = "Dynamic code";
  if ((pSVar2->dwHostSourceContext != 0xffffffffffffffff) &&
     ((pSVar2->isHostDynamicDocument & 1U) == 0)) {
    pSVar2 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)body);
    string = (pSVar2->field_5).field_0.url;
    if (string != (char16_t *)0x0) {
      sVar3 = PAL_wcslen(string);
      uVar1 = UInt32Math::MulAdd<3u,1u>((uint32)sVar3);
      data.plusSize = (size_t)uVar1;
      *urlBufferLength = data.plusSize;
      local_50 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_31dec53;
      data.filename._0_4_ = 0xb0;
      this = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
      puVar4 = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(this,*urlBufferLength);
      if (puVar4 != (utf8char_t *)0x0) {
        utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                  (puVar4,*urlBufferLength,string,(uint32)sVar3);
        return puVar4;
      }
    }
    puVar4 = (utf8char_t *)0x0;
  }
  return puVar4;
}

Assistant:

utf8char_t* VTuneChakraProfile::GetUrl(Js::FunctionBody* body, size_t* urlBufferLength )
{
    utf8char_t* utf8Url = NULL;
    if (!body->GetSourceContextInfo()->IsDynamic())
    {
        const wchar* url = body->GetSourceContextInfo()->url;
        if (url)
        {
            size_t urlCharLength = wcslen(url);
            charcount_t ccUrlCharLength = static_cast<charcount_t>(urlCharLength);
            ccUrlCharLength = min(ccUrlCharLength, UINT_MAX);       // Just truncate if it is too big

            *urlBufferLength = UInt32Math::MulAdd<3, 1>(ccUrlCharLength);
            utf8Url = HeapNewNoThrowArray(utf8char_t, *urlBufferLength);
            if (utf8Url)
            {
                utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Url, *urlBufferLength, url, ccUrlCharLength);
            }
        }
    }
    else
    {
        utf8Url = (utf8char_t*)VTuneChakraProfile::DynamicCode;
    }
    return utf8Url;
}